

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O2

void __thiscall
wasm::OptimizationOptions::PassInfo::PassInfo
          (PassInfo *this,string *name,int optimizeLevel,int shrinkLevel)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  (this->argument).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->optimizeLevel).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_payload._M_value = optimizeLevel;
  (this->optimizeLevel).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = true;
  (this->shrinkLevel).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_payload._M_value = shrinkLevel;
  (this->shrinkLevel).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = true;
  return;
}

Assistant:

PassInfo(std::string name, int optimizeLevel, int shrinkLevel)
      : name(name), optimizeLevel(optimizeLevel), shrinkLevel(shrinkLevel) {}